

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationSpeed.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMotorRotationSpeed::ArchiveOUT(ChLinkMotorRotationSpeed *this,ChArchiveOut *marchive)

{
  char *local_38;
  bool *local_30;
  undefined1 local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkMotorRotationSpeed>(marchive);
  ChLinkMotorRotation::ArchiveOUT(&this->super_ChLinkMotorRotation,marchive);
  local_30 = (bool *)&(this->super_ChLinkMotorRotation).field_0x278;
  local_38 = "rot_offset";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[4])(marchive,&local_38);
  local_30 = &this->avoid_angle_drift;
  local_38 = "avoid_angle_drift";
  local_28 = 0;
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  return;
}

Assistant:

void ChLinkMotorRotationSpeed::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkMotorRotationSpeed>();

    // serialize parent class
    ChLinkMotorRotation::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(rot_offset);
    marchive << CHNVP(avoid_angle_drift);
}